

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# crn_decomp.h
# Opt level: O0

bool __thiscall
crnd::crn_unpacker::unpack_dxt5a
          (crn_unpacker *this,uint8 **pDst,uint32 row_pitch_in_bytes,uint32 output_width,
          uint32 output_height)

{
  bool bVar1;
  uint32 uVar2;
  uint new_size;
  uint32 uVar3;
  uint uVar4;
  block_buffer_element *pbVar5;
  unsigned_short *puVar6;
  unsigned_short *puVar7;
  bool local_7d;
  uint16 *pAlpha0_selectors;
  uint32 alpha0_selector_index;
  uint8 endpoint_reference;
  block_buffer_element *buffer;
  uint32 x;
  bool visible;
  uint8 *puStack_48;
  uint32 y;
  uint32 *pData;
  uint32 f;
  uint8 reference_group;
  uint32 alpha0_endpoint_index;
  int32 delta_pitch_in_dwords;
  uint32 height;
  uint32 width;
  uint32 num_alpha_endpoints;
  uint32 output_height_local;
  uint32 output_width_local;
  uint32 row_pitch_in_bytes_local;
  uint8 **pDst_local;
  crn_unpacker *this_local;
  
  uVar2 = vector<unsigned_short>::size(&this->m_alpha_endpoints);
  new_size = output_width + 1 & 0xfffffffe;
  uVar3 = vector<crnd::crn_unpacker::block_buffer_element>::size(&this->m_block_buffer);
  if (uVar3 < new_size) {
    vector<crnd::crn_unpacker::block_buffer_element>::resize(&this->m_block_buffer,new_size);
  }
  f = 0;
  pData._7_1_ = 0;
  for (pData._0_4_ = 0;
      uVar4 = crn_packed_uint::operator_cast_to_unsigned_int
                        ((crn_packed_uint *)&this->m_pHeader->m_faces), (uint)pData < uVar4;
      pData._0_4_ = (uint)pData + 1) {
    puStack_48 = pDst[(uint)pData];
    for (x = 0; x < (output_height + 1 & 0xfffffffe); x = x + 1) {
      bVar1 = x < output_height;
      for (buffer._4_4_ = 0; buffer._4_4_ < new_size; buffer._4_4_ = buffer._4_4_ + 1) {
        local_7d = bVar1 && buffer._4_4_ < output_width;
        if (((x & 1) == 0) && ((buffer._4_4_ & 1) == 0)) {
          uVar3 = symbol_codec::decode(&this->m_codec,&this->m_reference_encoding_dm);
          pData._7_1_ = (byte)uVar3;
        }
        pbVar5 = vector<crnd::crn_unpacker::block_buffer_element>::operator[]
                           (&this->m_block_buffer,buffer._4_4_);
        if ((x & 1) == 0) {
          pAlpha0_selectors._7_1_ = pData._7_1_ & 3;
          pbVar5->endpoint_reference = (byte)((int)(uint)pData._7_1_ >> 2) & 3;
          pData._7_1_ = (byte)((int)(uint)pData._7_1_ >> 4);
        }
        else {
          pAlpha0_selectors._7_1_ = (byte)pbVar5->endpoint_reference;
        }
        if (pAlpha0_selectors._7_1_ == 0) {
          uVar3 = symbol_codec::decode(&this->m_codec,this->m_endpoint_delta_dm + 1);
          f = uVar3 + f;
          if (uVar2 <= f) {
            f = f - uVar2;
          }
          pbVar5->alpha0_endpoint_index = (uint16)f;
        }
        else if (pAlpha0_selectors._7_1_ == 1) {
          pbVar5->alpha0_endpoint_index = (uint16)f;
        }
        else {
          f = (uint32)pbVar5->alpha0_endpoint_index;
        }
        uVar3 = symbol_codec::decode(&this->m_codec,this->m_selector_delta_dm + 1);
        if (bVar1 && buffer._4_4_ < output_width) {
          puVar6 = vector<unsigned_short>::operator[](&this->m_alpha_selectors,uVar3 * 3);
          puVar7 = vector<unsigned_short>::operator[](&this->m_alpha_endpoints,f);
          *(uint *)puStack_48 = CONCAT22(*puVar6,*puVar7);
          *(undefined4 *)(puStack_48 + 4) = *(undefined4 *)(puVar6 + 1);
        }
        puStack_48 = puStack_48 + 8;
        bVar1 = local_7d;
      }
      puStack_48 = puStack_48 + (long)(int)((row_pitch_in_bytes >> 2) + new_size * -2) * 4;
    }
  }
  return true;
}

Assistant:

bool unpack_dxt5a(uint8** pDst, uint32 row_pitch_in_bytes, uint32 output_width, uint32 output_height) {
    const uint32 num_alpha_endpoints = m_alpha_endpoints.size();
    const uint32 width = output_width + 1 & ~1;
    const uint32 height = output_height + 1 & ~1;
    const int32 delta_pitch_in_dwords = (row_pitch_in_bytes >> 2) - (width << 1);

    if (m_block_buffer.size() < width)
      m_block_buffer.resize(width);

    uint32 alpha0_endpoint_index = 0;
    uint8 reference_group = 0;

    for (uint32 f = 0; f < m_pHeader->m_faces; f++) {
      uint32* pData = (uint32*)pDst[f];
      for (uint32 y = 0; y < height; y++, pData += delta_pitch_in_dwords) {
        bool visible = y < output_height;
        for (uint32 x = 0; x < width; x++, pData += 2) {
          visible = visible && x < output_width;
          if (!(y & 1) && !(x & 1))
            reference_group = m_codec.decode(m_reference_encoding_dm);
          block_buffer_element &buffer = m_block_buffer[x];
          uint8 endpoint_reference;
          if (y & 1) {
            endpoint_reference = buffer.endpoint_reference;
          } else {
            endpoint_reference = reference_group & 3;
            reference_group >>= 2;
            buffer.endpoint_reference = reference_group & 3;
            reference_group >>= 2;
          }
          if (!endpoint_reference) {
            alpha0_endpoint_index += m_codec.decode(m_endpoint_delta_dm[1]);
            if (alpha0_endpoint_index >= num_alpha_endpoints)
              alpha0_endpoint_index -= num_alpha_endpoints;
            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
          } else if (endpoint_reference == 1) {
            buffer.alpha0_endpoint_index = alpha0_endpoint_index;
          } else {
            alpha0_endpoint_index = buffer.alpha0_endpoint_index;
          }
          uint32 alpha0_selector_index = m_codec.decode(m_selector_delta_dm[1]);
          if (visible) {
            const uint16* pAlpha0_selectors = &m_alpha_selectors[alpha0_selector_index * 3];
            pData[0] = m_alpha_endpoints[alpha0_endpoint_index] | (pAlpha0_selectors[0] << 16);
            pData[1] = pAlpha0_selectors[1] | (pAlpha0_selectors[2] << 16);
          }
        }
      }
    }
    return true;
  }